

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O2

void conn_report_connect_stats(Curl_easy *data,connectdata *conn)

{
  Curl_cfilter *pCVar1;
  curltime timestamp;
  curltime timestamp_00;
  curltime appconnected;
  curltime connected;
  
  pCVar1 = conn->cfilter[0];
  if (pCVar1 != (Curl_cfilter *)0x0) {
    connected.tv_sec = 0;
    connected.tv_usec = 0;
    connected._12_4_ = 0;
    (*pCVar1->cft->query)(pCVar1,data,4,(int *)0x0,&connected);
    timestamp.tv_usec = connected.tv_usec;
    timestamp.tv_sec = connected.tv_sec;
    if (connected.tv_usec != 0 || connected.tv_sec != 0) {
      timestamp._12_4_ = 0;
      Curl_pgrsTimeWas(data,TIMER_CONNECT,timestamp);
    }
    appconnected.tv_sec = 0;
    appconnected.tv_usec = 0;
    appconnected._12_4_ = 0;
    (*pCVar1->cft->query)(pCVar1,data,5,(int *)0x0,&appconnected);
    timestamp_00.tv_usec = appconnected.tv_usec;
    timestamp_00.tv_sec = appconnected.tv_sec;
    if (appconnected.tv_usec != 0 || appconnected.tv_sec != 0) {
      timestamp_00._12_4_ = 0;
      Curl_pgrsTimeWas(data,TIMER_APPCONNECT,timestamp_00);
    }
  }
  return;
}

Assistant:

static void conn_report_connect_stats(struct Curl_easy *data,
                                      struct connectdata *conn)
{
  struct Curl_cfilter *cf = conn->cfilter[FIRSTSOCKET];
  if(cf) {
    struct curltime connected;
    struct curltime appconnected;

    memset(&connected, 0, sizeof(connected));
    cf->cft->query(cf, data, CF_QUERY_TIMER_CONNECT, NULL, &connected);
    if(connected.tv_sec || connected.tv_usec)
      Curl_pgrsTimeWas(data, TIMER_CONNECT, connected);

    memset(&appconnected, 0, sizeof(appconnected));
    cf->cft->query(cf, data, CF_QUERY_TIMER_APPCONNECT, NULL, &appconnected);
    if(appconnected.tv_sec || appconnected.tv_usec)
      Curl_pgrsTimeWas(data, TIMER_APPCONNECT, appconnected);
  }
}